

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,std::pair<unsigned_int,unsigned_int>>
               (Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                *col,set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *setcont,vector<unsigned_int,_std::allocator<unsigned_int>_> *veccont)

{
  undefined8 uVar1;
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *this;
  bool bVar2;
  lazy_ostream *plVar3;
  size_type sVar4;
  ulong uVar5;
  const_reference pvVar6;
  basic_cstring<const_char> local_3b8;
  basic_cstring<const_char> local_3a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_398;
  assertion_result local_378;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  basic_cstring<const_char> local_330;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_320;
  assertion_result local_300;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  uint local_2c4;
  undefined1 local_2c0 [4];
  uint i;
  basic_cstring<const_char> local_2b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2a0;
  assertion_result local_280;
  basic_cstring<const_char> local_268;
  basic_cstring<const_char> local_258;
  basic_cstring<const_char> local_248;
  basic_cstring<const_char> local_238;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_228;
  assertion_result local_208;
  basic_cstring<const_char> local_1f0;
  basic_cstring<const_char> local_1e0;
  size_type local_1d0;
  size_t local_1c8;
  basic_cstring<const_char> local_1c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1b0;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  basic_cstring<const_char> local_168;
  basic_cstring<const_char> local_158;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_148;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  assertion_result local_110;
  basic_cstring<const_char> local_f8;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b8;
  column_content<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>
  local_88;
  assertion_result local_58;
  basic_cstring<const_char> local_40;
  basic_cstring<const_char> local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *veccont_local;
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *setcont_local;
  Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
  *col_local;
  
  local_20 = veccont;
  veccont_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)setcont;
  setcont_local =
       (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        *)col;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_30,0x11d,&local_40);
    get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>
              (&local_88,
               (Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                *)setcont_local);
    bVar2 = std::operator==(&local_88,
                            (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             *)veccont_local);
    boost::test_tools::assertion_result::assertion_result(&local_58,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,"get_column_content_via_iterators(col) == setcont",0x30);
    boost::unit_test::operator<<(&local_b8,plVar3,&local_c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_58,&local_b8,&local_d8,0x11d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b8);
    boost::test_tools::assertion_result::~assertion_result(&local_58);
    std::
    set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~set(&local_88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e8,0x11e,&local_f8);
    this = setcont_local;
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_20);
    Gudhi::persistence_matrix::
    Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
    ::get_content(&local_128,
                  (Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                   *)this,(int)sVar4);
    bVar2 = std::operator==(&local_128,local_20);
    boost::test_tools::assertion_result::assertion_result(&local_110,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_148,plVar3,&local_158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_110,&local_148,&local_168,0x11e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_148);
    boost::test_tools::assertion_result::~assertion_result(&local_110);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_128);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_188);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_178,0x120,&local_188);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1b0,plVar3,(char (*) [1])0x2c414a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_1c8 = Gudhi::persistence_matrix::
                Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                ::size((Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                        *)setcont_local);
    local_1d0 = std::
                set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ::size((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        *)veccont_local);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_1b0,&local_1c0,0x120,1,2,&local_1c8,"col.size()",&local_1d0,"setcont.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(local_20);
  if (bVar2) {
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f0);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e0,0x124,&local_1f0);
      bVar2 = Gudhi::persistence_matrix::
              Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
              ::is_empty((Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                          *)setcont_local);
      boost::test_tools::assertion_result::assertion_result(&local_208,bVar2);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_238,"col.is_empty()",0xe);
      boost::unit_test::operator<<(&local_228,plVar3,&local_238);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_248,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion(&local_208,&local_228,&local_248,0x124,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_228);
      boost::test_tools::assertion_result::~assertion_result(&local_208);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  else {
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_258,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_268);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0x126,&local_268);
      bVar2 = Gudhi::persistence_matrix::
              Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
              ::is_empty((Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                          *)setcont_local);
      boost::test_tools::assertion_result::assertion_result(&local_280,!bVar2);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2b0,"!col.is_empty()",0xf);
      boost::unit_test::operator<<(&local_2a0,plVar3,&local_2b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)local_2c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion(&local_280,&local_2a0,local_2c0,0x126,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_2a0);
      boost::test_tools::assertion_result::~assertion_result(&local_280);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  for (local_2c4 = 0; uVar5 = (ulong)local_2c4,
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_20),
      uVar5 < sVar4; local_2c4 = local_2c4 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_20,(ulong)local_2c4);
    if (*pvVar6 == 0) {
      do {
        uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_2d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                   ,0x73);
        boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e8);
        boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2d8,0x12a,&local_2e8);
        bVar2 = Gudhi::persistence_matrix::
                Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                ::is_non_zero((Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                               *)setcont_local,local_2c4);
        boost::test_tools::assertion_result::assertion_result(&local_300,!bVar2);
        plVar3 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_330,"!col.is_non_zero(i)",0x13);
        boost::unit_test::operator<<(&local_320,plVar3,&local_330);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_340,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                   ,0x73);
        boost::test_tools::tt_detail::report_assertion(&local_300,&local_320,&local_340,0x12a,1,0,0)
        ;
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(&local_320);
        boost::test_tools::assertion_result::~assertion_result(&local_300);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
    else {
      do {
        uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_350,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                   ,0x73);
        boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_360);
        boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_350,300,&local_360);
        bVar2 = Gudhi::persistence_matrix::
                Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                ::is_non_zero((Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                               *)setcont_local,local_2c4);
        boost::test_tools::assertion_result::assertion_result(&local_378,bVar2);
        plVar3 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_3a8,"col.is_non_zero(i)",0x12);
        boost::unit_test::operator<<(&local_398,plVar3,&local_3a8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_3b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                   ,0x73);
        boost::test_tools::tt_detail::report_assertion(&local_378,&local_398,&local_3b8,300,1,0,0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(&local_398);
        boost::test_tools::assertion_result::~assertion_result(&local_378);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}